

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O1

int lj_cf_ffi_offsetof(lua_State *L)

{
  uint uVar1;
  CTState *cts;
  TValue *pTVar2;
  bool bVar3;
  CTypeID id;
  undefined8 in_RAX;
  GCstr *name;
  CType *pCVar4;
  uint uVar5;
  CTSize ofs;
  CTSize local_24;
  
  local_24 = (CTSize)((ulong)in_RAX >> 0x20);
  cts = *(CTState **)((L->glref).ptr64 + 0x180);
  cts->L = L;
  id = ffi_checkctype(L,cts,(TValue *)0x0);
  name = lj_lib_checkstr(L,2);
  pCVar4 = lj_ctype_rawref(cts,id);
  if ((pCVar4->info & 0xf0000000) != 0x10000000) {
    return 0;
  }
  if (pCVar4->size == 0xffffffff) {
    return 0;
  }
  pCVar4 = lj_ctype_getfieldq(cts,pCVar4,name,&local_24,(CTInfo *)0x0);
  if (pCVar4 == (CType *)0x0) {
LAB_001224d0:
    bVar3 = true;
  }
  else {
    L->top[-1].n = (double)(int)local_24;
    uVar1 = pCVar4->info;
    uVar5 = uVar1 >> 0x1c;
    if (uVar5 == 9) {
      pCVar4 = (CType *)0x1;
    }
    else {
      if (uVar5 != 10) goto LAB_001224d0;
      pTVar2 = L->top;
      L->top = pTVar2 + 1;
      pTVar2->n = (double)(uVar1 & 0x7f);
      pTVar2 = L->top;
      L->top = pTVar2 + 1;
      pTVar2->n = (double)(pCVar4->info >> 8 & 0x7f);
      pCVar4 = (CType *)0x3;
    }
    bVar3 = false;
  }
  if (bVar3) {
    return 0;
  }
  return (int)pCVar4;
}

Assistant:

LJLIB_CF(ffi_offsetof)	LJLIB_REC(ffi_xof FF_ffi_offsetof)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, NULL);
  GCstr *name = lj_lib_checkstr(L, 2);
  CType *ct = lj_ctype_rawref(cts, id);
  CTSize ofs;
  if (ctype_isstruct(ct->info) && ct->size != CTSIZE_INVALID) {
    CType *fct = lj_ctype_getfield(cts, ct, name, &ofs);
    if (fct) {
      setintV(L->top-1, ofs);
      if (ctype_isfield(fct->info)) {
	return 1;
      } else if (ctype_isbitfield(fct->info)) {
	setintV(L->top++, ctype_bitpos(fct->info));
	setintV(L->top++, ctype_bitbsz(fct->info));
	return 3;
      }
    }
  }
  return 0;
}